

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFunctionalTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::FboTests::init(FboTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  FboApiTests::FboApiTests((FboApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createFboCompletenessTests((this->super_TestCaseGroup).m_context)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboRenderTestGroup::FboRenderTestGroup
            ((FboRenderTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboColorTests::FboColorTests((FboColorTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboDepthTests::FboDepthTests((FboDepthTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboStencilTests::FboStencilTests((FboStencilTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FramebufferBlitTests::FramebufferBlitTests
            ((FramebufferBlitTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboMultisampleTests::FboMultisampleTests
            ((FboMultisampleTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboInvalidateTests::FboInvalidateTests
            ((FboInvalidateTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new FboApiTests			(m_context));
		addChild(createFboCompletenessTests	(m_context));
		addChild(new FboRenderTestGroup		(m_context));
		addChild(new FboColorTests			(m_context));
		addChild(new FboDepthTests			(m_context));
		addChild(new FboStencilTests		(m_context));
		addChild(new FramebufferBlitTests	(m_context));
		addChild(new FboMultisampleTests	(m_context));
		addChild(new FboInvalidateTests		(m_context));
	}